

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

float lda_loop(lda *l,v_array<float> *Elogtheta,float *v,example *ec,float param_5)

{
  byte bVar1;
  float *pfVar2;
  size_t sVar3;
  size_t sVar4;
  size_t k_1;
  weight *pwVar5;
  long lVar6;
  size_t sVar7;
  byte *pbVar8;
  ulong uVar9;
  float *pfVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  size_t *psVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  example *__range2;
  float local_60;
  float local_5c;
  vw *local_58;
  v_array<float> *local_50;
  features *local_48;
  byte *local_40;
  byte *local_38;
  
  local_58 = l->all;
  local_50 = Elogtheta;
  v_array<float>::clear((v_array<float> *)&(anonymous_namespace)::new_gamma);
  v_array<float>::clear((v_array<float> *)&(anonymous_namespace)::old_gamma);
  for (uVar12 = 0; uVar9 = l->topics, uVar12 < uVar9; uVar12 = uVar12 + 1) {
    local_5c = 1.0;
    v_array<float>::push_back((v_array<float> *)&(anonymous_namespace)::new_gamma,&local_5c);
    local_60 = 0.0;
    v_array<float>::push_back((v_array<float> *)&(anonymous_namespace)::old_gamma,&local_60);
  }
  local_58 = (vw *)&local_58->weights;
  local_48 = (ec->super_example_predict).feature_space;
  do {
    memcpy(v,(anonymous_namespace)::new_gamma,uVar9 << 2);
    lda::expdigammify(l,l->all,v);
    memcpy((anonymous_namespace)::old_gamma,(anonymous_namespace)::new_gamma,l->topics << 2);
    memset((anonymous_namespace)::new_gamma,0,l->topics << 2);
    local_40 = (ec->super_example_predict).indices._end;
    fVar17 = 0.0;
    fVar18 = 0.0;
    pbVar8 = (ec->super_example_predict).indices._begin;
    while (pbVar8 != local_40) {
      bVar1 = *pbVar8;
      pfVar2 = local_48[bVar1].values._end;
      psVar13 = local_48[bVar1].indicies._begin;
      local_38 = pbVar8;
      for (pfVar10 = local_48[bVar1].values._begin; pfVar10 != pfVar2; pfVar10 = pfVar10 + 1) {
        pwVar5 = parameters::operator[]((parameters *)local_58,*psVar13);
        sVar3 = l->topics;
        fVar14 = find_cw(l,pwVar5 + sVar3 + 1,v);
        fVar16 = *pfVar10;
        fVar15 = logf(fVar14);
        sVar4 = l->topics;
        for (sVar7 = 0; sVar4 != sVar7; sVar7 = sVar7 + 1) {
          (anonymous_namespace)::new_gamma[sVar7] =
               (pwVar5 + sVar3 + 1)[sVar7] * fVar14 * fVar16 +
               (anonymous_namespace)::new_gamma[sVar7];
        }
        fVar18 = fVar18 - fVar16 * fVar15;
        fVar17 = fVar17 + *pfVar10;
        psVar13 = psVar13 + 1;
      }
      pbVar8 = local_38 + 1;
    }
    for (uVar12 = 0; uVar9 = l->topics, uVar12 < uVar9; uVar12 = uVar12 + 1) {
      (anonymous_namespace)::new_gamma[uVar12] =
           (anonymous_namespace)::new_gamma[uVar12] * v[uVar12] + l->lda_alpha;
    }
    lVar6 = (ulong)l->all->lda << 2;
    fVar16 = 0.0;
    for (lVar11 = 0; lVar6 != lVar11; lVar11 = lVar11 + 4) {
      fVar16 = fVar16 + ABS(*(float *)((long)(anonymous_namespace)::old_gamma + lVar11) -
                            *(float *)((long)(anonymous_namespace)::new_gamma + lVar11));
    }
    fVar14 = 0.0;
    for (lVar11 = 0; lVar6 != lVar11; lVar11 = lVar11 + 4) {
      fVar14 = fVar14 + *(float *)((long)(anonymous_namespace)::new_gamma + lVar11);
    }
  } while (l->lda_epsilon <= fVar16 / fVar14 && fVar16 / fVar14 != l->lda_epsilon);
  v_array<float>::clear(&(ec->pred).scalars);
  v_array<float>::resize(&(ec->pred).scalars,l->topics);
  memcpy((ec->pred).scalars._begin,(anonymous_namespace)::new_gamma,l->topics << 2);
  (ec->pred).scalars._end = (ec->pred).scalars._begin + l->topics;
  fVar16 = theta_kl(l,local_50,(anonymous_namespace)::new_gamma);
  return (fVar16 + fVar18) / fVar17;
}

Assistant:

float lda_loop(lda &l, v_array<float> &Elogtheta, float *v, example *ec, float)
{
  parameters &weights = l.all->weights;
  new_gamma.clear();
  old_gamma.clear();

  for (size_t i = 0; i < l.topics; i++)
  {
    new_gamma.push_back(1.f);
    old_gamma.push_back(0.f);
  }
  size_t num_words = 0;
  for (features &fs : *ec) num_words += fs.size();

  float xc_w = 0;
  float score = 0;
  float doc_length = 0;
  do
  {
    memcpy(v, new_gamma.begin(), sizeof(float) * l.topics);
    l.expdigammify(*l.all, v);

    memcpy(old_gamma.begin(), new_gamma.begin(), sizeof(float) * l.topics);
    memset(new_gamma.begin(), 0, sizeof(float) * l.topics);

    score = 0;
    size_t word_count = 0;
    doc_length = 0;
    for (features &fs : *ec)
    {
      for (features::iterator &f : fs)
      {
        float *u_for_w = &(weights[f.index()]) + l.topics + 1;
        float c_w = find_cw(l, u_for_w, v);
        xc_w = c_w * f.value();
        score += -f.value() * log(c_w);
        size_t max_k = l.topics;
        for (size_t k = 0; k < max_k; k++, ++u_for_w) new_gamma[k] += xc_w * *u_for_w;
        word_count++;
        doc_length += f.value();
      }
    }
    for (size_t k = 0; k < l.topics; k++) new_gamma[k] = new_gamma[k] * v[k] + l.lda_alpha;
  } while (average_diff(*l.all, old_gamma.begin(), new_gamma.begin()) > l.lda_epsilon);

  ec->pred.scalars.clear();
  ec->pred.scalars.resize(l.topics);
  memcpy(ec->pred.scalars.begin(), new_gamma.begin(), l.topics * sizeof(float));
  ec->pred.scalars.end() = ec->pred.scalars.begin() + l.topics;

  score += theta_kl(l, Elogtheta, new_gamma.begin());

  return score / doc_length;
}